

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

size_t nni_aio_iov_advance(nni_aio *aio,size_t n)

{
  uint local_2c;
  size_t sStack_28;
  uint i;
  size_t residual;
  size_t n_local;
  nni_aio *aio_local;
  
  sStack_28 = n;
  residual = n;
  while( true ) {
    if (residual == 0) {
      return sStack_28;
    }
    if (aio->a_nio == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",
                0x2e4,"aio->a_nio != 0");
    }
    if (residual < aio->a_iov[0].iov_len) break;
    sStack_28 = sStack_28 - aio->a_iov[0].iov_len;
    residual = residual - aio->a_iov[0].iov_len;
    aio->a_nio = aio->a_nio - 1;
    for (local_2c = 0; local_2c < aio->a_nio; local_2c = local_2c + 1) {
      aio->a_iov[local_2c].iov_buf = aio->a_iov[local_2c + 1].iov_buf;
      aio->a_iov[local_2c].iov_len = aio->a_iov[local_2c + 1].iov_len;
    }
    aio->a_iov[aio->a_nio].iov_buf = (void *)0x0;
    aio->a_iov[aio->a_nio].iov_len = 0;
  }
  aio->a_iov[0].iov_len = aio->a_iov[0].iov_len - residual;
  aio->a_iov[0].iov_buf = (void *)((long)aio->a_iov[0].iov_buf + residual);
  return 0;
}

Assistant:

size_t
nni_aio_iov_advance(nni_aio *aio, size_t n)
{
	size_t residual = n;
	while (n) {
		NNI_ASSERT(aio->a_nio != 0);
		if (aio->a_iov[0].iov_len > n) {
			aio->a_iov[0].iov_len -= n;
			NNI_INCPTR(aio->a_iov[0].iov_buf, n);
			return (0); // we used all of "n"
		}
		residual -= aio->a_iov[0].iov_len;
		n -= aio->a_iov[0].iov_len;
		aio->a_nio--;
		for (unsigned i = 0; i < aio->a_nio; i++) {
			aio->a_iov[i] = aio->a_iov[i + 1];
		}
		aio->a_iov[aio->a_nio].iov_buf = NULL; // serves as indicator
		aio->a_iov[aio->a_nio].iov_len = 0;    // serves as indicator
	}
	return (residual); // we might not have used all of n for this iov
}